

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

size_t unicode_to_utf16be(char *p,size_t remaining,uint32_t uc)

{
  char *utf16;
  uint32_t uc_local;
  size_t remaining_local;
  char *p_local;
  
  if (uc < 0x10000) {
    if (remaining < 2) {
      p_local = (char *)0x0;
    }
    else {
      archive_be16enc(p,(uint16_t)uc);
      p_local = (char *)0x2;
    }
  }
  else if (remaining < 4) {
    p_local = (char *)0x0;
  }
  else {
    archive_be16enc(p,((ushort)(uc - 0x10000 >> 10) & 0x3ff) + 0xd800);
    archive_be16enc(p + 2,((ushort)(uc - 0x10000) & 0x3ff) + 0xdc00);
    p_local = (char *)0x4;
  }
  return (size_t)p_local;
}

Assistant:

static size_t
unicode_to_utf16be(char *p, size_t remaining, uint32_t uc)
{
	char *utf16 = p;

	if (uc > 0xffff) {
		/* We have a code point that won't fit into a
		 * wchar_t; convert it to a surrogate pair. */
		if (remaining < 4)
			return (0);
		uc -= 0x10000;
		archive_be16enc(utf16, ((uc >> 10) & 0x3ff) + 0xD800);
		archive_be16enc(utf16+2, (uc & 0x3ff) + 0xDC00);
		return (4);
	} else {
		if (remaining < 2)
			return (0);
		archive_be16enc(utf16, uc);
		return (2);
	}
}